

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_int>::updateHandle
          (btAxisSweep3Internal<unsigned_int> *this,uint handle,btVector3 *aabbMin,
          btVector3 *aabbMax,btDispatcher *dispatcher)

{
  uint edge;
  uint edge_00;
  Handle *pHVar1;
  Edge *pEVar2;
  int iVar3;
  int iVar4;
  int axis;
  int axis_00;
  long lVar5;
  uint max [3];
  uint min [3];
  uint local_48 [6];
  
  pHVar1 = this->m_pHandles;
  lVar5 = 0;
  quantize(this,local_48 + 3,aabbMin,0);
  quantize(this,local_48,aabbMax,1);
  do {
    edge = *(uint *)((long)(&pHVar1[handle].super_btBroadphaseProxy.m_aabbMax + 1) + lVar5 * 4);
    edge_00 = pHVar1[handle].m_maxEdges[lVar5];
    pEVar2 = this->m_pEdges[lVar5];
    iVar3 = local_48[lVar5] - pEVar2[edge_00].m_pos;
    iVar4 = local_48[lVar5 + 3] - pEVar2[edge].m_pos;
    pEVar2[edge].m_pos = local_48[lVar5 + 3];
    pEVar2[edge_00].m_pos = local_48[lVar5];
    axis_00 = (int)lVar5;
    if (iVar4 < 0) {
      sortMinDown(this,axis_00,edge,dispatcher,true);
    }
    if (0 < iVar3) {
      sortMaxUp(this,axis_00,edge_00,dispatcher,true);
    }
    if (0 < iVar4) {
      sortMinUp(this,axis_00,edge,dispatcher,true);
    }
    if (iVar3 < 0) {
      sortMaxDown(this,axis_00,edge_00,dispatcher,true);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::updateHandle(BP_FP_INT_TYPE handle, const btVector3& aabbMin,const btVector3& aabbMax,btDispatcher* dispatcher)
{
//	btAssert(bounds.IsFinite());
	//btAssert(bounds.HasVolume());

	Handle* pHandle = getHandle(handle);

	// quantize the new bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// update changed edges
	for (int axis = 0; axis < 3; axis++)
	{
		BP_FP_INT_TYPE emin = pHandle->m_minEdges[axis];
		BP_FP_INT_TYPE emax = pHandle->m_maxEdges[axis];

		int dmin = (int)min[axis] - (int)m_pEdges[axis][emin].m_pos;
		int dmax = (int)max[axis] - (int)m_pEdges[axis][emax].m_pos;

		m_pEdges[axis][emin].m_pos = min[axis];
		m_pEdges[axis][emax].m_pos = max[axis];

		// expand (only adds overlaps)
		if (dmin < 0)
			sortMinDown(axis, emin,dispatcher,true);

		if (dmax > 0)
			sortMaxUp(axis, emax,dispatcher,true);

		// shrink (only removes overlaps)
		if (dmin > 0)
			sortMinUp(axis, emin,dispatcher,true);

		if (dmax < 0)
			sortMaxDown(axis, emax,dispatcher,true);

#ifdef DEBUG_BROADPHASE
	debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE
	}

	
}